

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void Fixpp::impl::
     visitMessage<Fixpp::impl::MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>,DefaultTestRules<Fixpp::v44::Spec::Dictionary>,Fixpp::TypedParsingContext<void>>
               (ParsingContext *context,undefined8 visitor)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  string msgTypeStr;
  undefined1 local_80 [8];
  string versionStr_1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string versionStr;
  VisitStatus status;
  MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,_DefaultTestRules<Fixpp::v44::Spec::Dictionary>_>
  *visitor_local;
  TypedParsingContext<void> *context_local;
  
  versionStr.field_2._12_4_ =
       visitDictionary<Fixpp::v44::Spec::Dictionary,Fixpp::TypedParsingContext<void>,Fixpp::impl::MessageVisitor<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
                 (context,visitor);
  if (versionStr.field_2._12_4_ == VersionMismatch) {
    pcVar2 = (context->version).first;
    sVar1 = (context->version).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_48,pcVar2,sVar1,&local_49);
    std::allocator<char>::~allocator(&local_49);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_48);
    ParsingContext::setError
              (context,InvalidVersion,"FIX version mismatched, expected \'%s\', got \'%s\'",
               "FIX.4.4",pcVar2);
    std::__cxx11::string::~string((string *)local_48);
  }
  else if (versionStr.field_2._12_4_ == NotFound) {
    pcVar2 = (context->version).first;
    sVar1 = (context->version).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_80,pcVar2,sVar1,
               (allocator<char> *)(msgTypeStr.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(msgTypeStr.field_2._M_local_buf + 0xf));
    pcVar2 = (context->msgType).first;
    sVar1 = (context->msgType).second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a8,pcVar2,sVar1,&local_a9);
    std::allocator<char>::~allocator(&local_a9);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_a8);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
    ParsingContext::setError
              (context,UnknownMessage,"Unknown MsgType(%s) for FIX version %s",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)local_80);
  }
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
        {

            using Dictionary = typename Rules::Dictionary;
            using Version = typename Dictionary::Version;

            auto status = visitDictionary<Dictionary>(context, visitor, rules);

            if (status == VisitStatus::VersionMismatch)
            {
                std::string versionStr(context.version.first, context.version.second);

                context.setError(ErrorKind::InvalidVersion, "FIX version mismatched, expected '%s', got '%s'",
                        Version::Str, versionStr.c_str());
            }
            else if (status == VisitStatus::NotFound)
            {
                std::string versionStr(context.version.first, context.version.second);
                std::string msgTypeStr(context.msgType.first, context.msgType.second);

                context.setError(ErrorKind::UnknownMessage, "Unknown MsgType(%s) for FIX version %s", msgTypeStr.c_str(), versionStr.c_str());
            }
        }